

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O1

int adl_switchEmulator(ADL_MIDIPlayer *device,int emulator)

{
  MIDIplay *this;
  bool bVar1;
  string local_48;
  
  if (device != (ADL_MIDIPlayer *)0x0) {
    this = (MIDIplay *)device->adl_midiPlayer;
    if (this == (MIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x354,"int adl_switchEmulator(struct ADL_MIDIPlayer *, int)");
    }
    bVar1 = adl_isEmulatorAvailable(emulator);
    if (bVar1) {
      (this->m_setup).emulator = emulator;
      MIDIplay::partialReset(this);
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"OPL3 MIDI: Unknown emulation core!","");
      MIDIplay::setErrorString(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    if (bVar1) {
      return 0;
    }
  }
  return -1;
}

Assistant:

ADLMIDI_EXPORT int adl_switchEmulator(struct ADL_MIDIPlayer *device, int emulator)
{
    if(device)
    {
        MidiPlayer *play = GET_MIDI_PLAYER(device);
        assert(play);
        if(adl_isEmulatorAvailable(emulator))
        {
            play->m_setup.emulator = emulator;
#ifdef ADLMIDI_ENABLE_HW_SERIAL
            play->m_setup.serial = false;
#endif
            play->partialReset();
            return 0;
        }
        play->setErrorString("OPL3 MIDI: Unknown emulation core!");
    }
    return -1;
}